

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

int bam_mplp_auto(bam_mplp_t iter,int *_tid,int *_pos,int *n_plp,bam_pileup1_t **plp)

{
  int iVar1;
  bam_pileup1_t *pbVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int pos;
  int tid;
  int *local_40;
  int *local_38;
  
  uVar8 = 0xffffffffffffffff;
  lVar6 = 0;
  lVar7 = 0;
  local_40 = _tid;
  local_38 = _pos;
  do {
    if (iter->n <= lVar7) {
      iter->min = uVar8;
      if (uVar8 == 0xffffffffffffffff) {
        iVar1 = 0;
      }
      else {
        *local_40 = (int)(uVar8 >> 0x20);
        *local_38 = (int)uVar8;
        iVar1 = 0;
        for (lVar6 = 0; lVar6 < iter->n; lVar6 = lVar6 + 1) {
          if (iter->pos[lVar6] == uVar8) {
            iVar5 = iter->n_plp[lVar6];
            pbVar2 = iter->plp[lVar6];
            iVar1 = iVar1 + 1;
          }
          else {
            iVar5 = 0;
            pbVar2 = (bam_pileup1_t *)0x0;
          }
          n_plp[lVar6] = iVar5;
          plp[lVar6] = pbVar2;
        }
      }
      return iVar1;
    }
    uVar3 = *(ulong *)((long)iter->pos + lVar6 * 2);
    if (uVar3 == iter->min) {
      pbVar2 = bam_plp_auto(*(bam_plp_t *)((long)iter->iter + lVar6 * 2),&tid,&pos,
                            (int *)((long)iter->n_plp + lVar6));
      *(bam_pileup1_t **)((long)iter->plp + lVar6 * 2) = pbVar2;
      if (*(int *)(*(long *)((long)iter->iter + lVar6 * 2) + 0x38) != 0) {
        return -1;
      }
      lVar4 = *(long *)((long)iter->plp + lVar6 * 2);
      uVar3 = (long)pos | (ulong)(uint)tid << 0x20;
      if (lVar4 == 0) {
        uVar3 = 0;
      }
      *(ulong *)((long)iter->pos + lVar6 * 2) = uVar3;
    }
    else {
      lVar4 = *(long *)((long)iter->plp + lVar6 * 2);
    }
    if (uVar8 <= uVar3) {
      uVar3 = uVar8;
    }
    if (lVar4 != 0) {
      uVar8 = uVar3;
    }
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 4;
  } while( true );
}

Assistant:

int bam_mplp_auto(bam_mplp_t iter, int *_tid, int *_pos, int *n_plp, const bam_pileup1_t **plp)
{
    int i, ret = 0;
    uint64_t new_min = (uint64_t)-1;
    for (i = 0; i < iter->n; ++i) {
        if (iter->pos[i] == iter->min) {
            int tid, pos;
            iter->plp[i] = bam_plp_auto(iter->iter[i], &tid, &pos, &iter->n_plp[i]);
            if ( iter->iter[i]->error ) return -1;
            iter->pos[i] = iter->plp[i] ? (uint64_t)tid<<32 | pos : 0;
        }
        if (iter->plp[i] && iter->pos[i] < new_min) new_min = iter->pos[i];
    }
    iter->min = new_min;
    if (new_min == (uint64_t)-1) return 0;
    *_tid = new_min>>32; *_pos = (uint32_t)new_min;
    for (i = 0; i < iter->n; ++i) {
        if (iter->pos[i] == iter->min) { // FIXME: valgrind reports "uninitialised value(s) at this line"
            n_plp[i] = iter->n_plp[i], plp[i] = iter->plp[i];
            ++ret;
        } else n_plp[i] = 0, plp[i] = 0;
    }
    return ret;
}